

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O3

ssize_t __thiscall VCProjectWriter::write(VCProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  QArrayData *pQVar1;
  QArrayData *pQVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  QArrayData *pQVar5;
  QArrayData *pQVar6;
  QArrayData *pQVar7;
  char16_t *pcVar8;
  qsizetype qVar9;
  undefined8 uVar10;
  XmlOutput *pXVar11;
  Node<QString,_QHashDummyValue> *pNVar12;
  XmlOutput *pXVar13;
  long lVar14;
  QString *key;
  undefined4 in_register_00000034;
  ulong uVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QByteArrayView QVar26;
  QByteArrayView QVar27;
  QByteArrayView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QByteArrayView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QByteArrayView QVar44;
  QByteArrayView QVar45;
  VCProject local_440;
  xml_output local_320;
  xml_output local_2e8;
  xml_output local_2b0;
  xml_output local_278;
  xml_output local_240;
  xml_output local_208;
  xml_output local_1d0;
  xml_output local_198;
  xml_output local_160;
  xml_output local_128;
  xml_output local_f0;
  xml_output local_b8;
  xml_output local_78;
  long local_38;
  
  pXVar13 = (XmlOutput *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar16.m_data = (storage_type *)0x3;
  QVar16.m_size = (qsizetype)&local_440;
  QString::fromUtf8(QVar16);
  qVar9 = local_440.Name.d.size;
  pcVar8 = local_440.Name.d.ptr;
  pQVar1 = (QArrayData *)CONCAT44(local_440.Name.d.d._4_4_,local_440.Name.d.d._0_4_);
  QVar17.m_data = &DAT_0000000c;
  QVar17.m_size = (qsizetype)&local_440;
  QString::fromUtf8(QVar17);
  local_440.ProjectGUID.d.d = (Data *)local_440.Name.d.size;
  pQVar2 = (QArrayData *)CONCAT44(local_440.Name.d.d._4_4_,local_440.Name.d.d._0_4_);
  local_440.Name.d.d._0_4_ = 2;
  local_440.Name.d.size = (qsizetype)pcVar8;
  local_440.Version.d.d = (Data *)qVar9;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_440.Version.d.size = (qsizetype)local_440.Name.d.ptr;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_440.Name.d.ptr = (char16_t *)pQVar1;
  local_440.Version.d.ptr = (char16_t *)pQVar2;
  pXVar11 = XmlOutput::operator<<(pXVar13,(xml_output *)&local_440);
  QVar18.m_data = (storage_type *)0x13;
  QVar18.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar18);
  local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
  pQVar7 = (QArrayData *)CONCAT44(local_78._4_4_,local_78.xo_type);
  local_78.xo_type = tTag;
  local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78.xo_value.d.d = (Data *)0x0;
  local_78.xo_value.d.ptr = (char16_t *)0x0;
  local_78.xo_value.d.size = 0;
  local_78.xo_text.d.d = (Data *)pQVar7;
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_78);
  QVar19.m_data = (storage_type *)0xa;
  QVar19.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar19);
  local_b8.xo_value.d.size = (qsizetype)local_b8.xo_text.d.ptr;
  local_b8.xo_value.d.ptr = (char16_t *)local_b8.xo_text.d.d;
  uVar10 = local_b8._0_8_;
  if (local_b8.xo_text.d.ptr == (char16_t *)0x0) {
    local_b8._0_8_ = local_b8._0_8_ & 0xffffffff00000000;
    local_b8.xo_text.d.d = (Data *)0x0;
    local_b8.xo_text.d.ptr = (char16_t *)0x0;
    local_b8.xo_text.d.size = 0;
    local_b8.xo_value.d.d = (Data *)0x0;
    local_b8.xo_value.d.ptr = (char16_t *)0x0;
    local_b8.xo_value.d.size = 0;
  }
  else {
    QVar20.m_data = (storage_type *)0xb;
    QVar20.m_size = (qsizetype)&local_b8;
    QString::fromUtf8(QVar20);
    local_b8.xo_text.d.size = (qsizetype)local_b8.xo_text.d.ptr;
    local_b8.xo_text.d.ptr = (char16_t *)local_b8.xo_text.d.d;
    local_b8.xo_text.d.d = (Data *)local_b8._0_8_;
    local_b8.xo_type = 7;
    if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_b8.xo_value.d.d = (Data *)uVar10;
    if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_b8.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_b8.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_b8.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_b8);
  if (*(long *)((long)__buf + 0x28) == 0) {
    local_f0.xo_type = tNothing;
    local_f0.xo_text.d.d = (Data *)0x0;
    local_f0.xo_text.d.ptr = (char16_t *)0x0;
    local_f0.xo_text.d.size = 0;
    local_f0.xo_value.d.d = (Data *)0x0;
    local_f0.xo_value.d.ptr = (char16_t *)0x0;
    local_f0.xo_value.d.size = 0;
  }
  else {
    QVar21.m_data = (storage_type *)0x7;
    QVar21.m_size = (qsizetype)&local_f0;
    QString::fromUtf8(QVar21);
    local_f0.xo_text.d.size = (qsizetype)local_f0.xo_text.d.ptr;
    pQVar6 = (QArrayData *)CONCAT44(local_f0._4_4_,local_f0.xo_type);
    local_f0.xo_type = tAttribute;
    local_f0.xo_text.d.ptr = (char16_t *)local_f0.xo_text.d.d;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_f0.xo_value.d.d = *(Data **)((long)__buf + 0x18);
    local_f0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x20);
    local_f0.xo_value.d.size = *(qsizetype *)((long)__buf + 0x28);
    if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    local_f0.xo_text.d.d = (Data *)pQVar6;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_f0);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_128._0_8_ = local_128._0_8_ & 0xffffffff00000000;
    local_128.xo_text.d.d = (Data *)0x0;
    local_128.xo_text.d.ptr = (char16_t *)0x0;
    local_128.xo_text.d.size = 0;
    local_128.xo_value.d.d = (Data *)0x0;
    local_128.xo_value.d.ptr = (char16_t *)0x0;
    local_128.xo_value.d.size = 0;
  }
  else {
    QVar22.m_data = (storage_type *)0x4;
    QVar22.m_size = (qsizetype)&local_128;
    QString::fromUtf8(QVar22);
    local_128.xo_text.d.size = (qsizetype)local_128.xo_text.d.ptr;
    local_128.xo_text.d.ptr = (char16_t *)local_128.xo_text.d.d;
    local_128.xo_text.d.d = (Data *)local_128._0_8_;
    local_128.xo_type = 7;
    if (&(local_128.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_128.xo_value.d.d = *__buf;
    local_128.xo_value.d.ptr = *(char16_t **)((long)__buf + 8);
    local_128.xo_value.d.size = *(qsizetype *)((long)__buf + 0x10);
    if (&(local_128.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    if (&(local_128.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_128.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_128.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i + -1
      ;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_128.xo_text.d.d)->_q_value).super___atomic_base<int>._M_i == 0)
      {
        QArrayData::deallocate(&(local_128.xo_text.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_128);
  if (*(long *)((long)__buf + 0x40) == 0) {
    local_160.xo_type = tNothing;
    local_160.xo_text.d.d = (Data *)0x0;
    local_160.xo_text.d.ptr = (char16_t *)0x0;
    local_160.xo_text.d.size = 0;
    local_160.xo_value.d.d = (Data *)0x0;
    local_160.xo_value.d.ptr = (char16_t *)0x0;
    local_160.xo_value.d.size = 0;
  }
  else {
    QVar23.m_data = (storage_type *)0xb;
    QVar23.m_size = (qsizetype)&local_160;
    QString::fromUtf8(QVar23);
    local_160.xo_text.d.size = (qsizetype)local_160.xo_text.d.ptr;
    pQVar6 = (QArrayData *)CONCAT44(local_160._4_4_,local_160.xo_type);
    local_160.xo_type = tAttribute;
    local_160.xo_text.d.ptr = (char16_t *)local_160.xo_text.d.d;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_160.xo_value.d.d = *(Data **)((long)__buf + 0x30);
    local_160.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x38);
    local_160.xo_value.d.size = *(qsizetype *)((long)__buf + 0x40);
    if (&(local_160.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_160.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_160.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_160.xo_text.d.d = (Data *)pQVar6;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_160);
  if (*(long *)((long)__buf + 0x58) == 0) {
    local_198.xo_type = tNothing;
    local_198.xo_text.d.d = (Data *)0x0;
    local_198.xo_text.d.ptr = (char16_t *)0x0;
    local_198.xo_text.d.size = 0;
    local_198.xo_value.d.d = (Data *)0x0;
    local_198.xo_value.d.ptr = (char16_t *)0x0;
    local_198.xo_value.d.size = 0;
  }
  else {
    QVar24.m_data = (storage_type *)0x7;
    QVar24.m_size = (qsizetype)&local_198;
    QString::fromUtf8(QVar24);
    local_198.xo_text.d.size = (qsizetype)local_198.xo_text.d.ptr;
    pQVar6 = (QArrayData *)CONCAT44(local_198._4_4_,local_198.xo_type);
    local_198.xo_type = tAttribute;
    local_198.xo_text.d.ptr = (char16_t *)local_198.xo_text.d.d;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_198.xo_value.d.d = *(Data **)((long)__buf + 0x48);
    local_198.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x50);
    local_198.xo_value.d.size = *(qsizetype *)((long)__buf + 0x58);
    if (&(local_198.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_198.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_198.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_198.xo_text.d.d = (Data *)pQVar6;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_198);
  if (*(long *)((long)__buf + 0x70) == 0) {
    local_1d0.xo_type = tNothing;
    local_1d0.xo_text.d.d = (Data *)0x0;
    local_1d0.xo_text.d.ptr = (char16_t *)0x0;
    local_1d0.xo_text.d.size = 0;
    local_1d0.xo_value.d.d = (Data *)0x0;
    local_1d0.xo_value.d.ptr = (char16_t *)0x0;
    local_1d0.xo_value.d.size = 0;
  }
  else {
    QVar25.m_data = (storage_type *)0xe;
    QVar25.m_size = (qsizetype)&local_1d0;
    QString::fromUtf8(QVar25);
    local_1d0.xo_text.d.size = (qsizetype)local_1d0.xo_text.d.ptr;
    pQVar6 = (QArrayData *)CONCAT44(local_1d0._4_4_,local_1d0.xo_type);
    local_1d0.xo_type = tAttribute;
    local_1d0.xo_text.d.ptr = (char16_t *)local_1d0.xo_text.d.d;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_1d0.xo_value.d.d = *(Data **)((long)__buf + 0x60);
    local_1d0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x68);
    local_1d0.xo_value.d.size = *(qsizetype *)((long)__buf + 0x70);
    if (&(local_1d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_1d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_1d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_1d0.xo_text.d.d = (Data *)pQVar6;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_1d0);
  if (*(long *)((long)__buf + 0x88) == 0) {
    local_208.xo_type = tNothing;
    local_208.xo_text.d.d = (Data *)0x0;
    local_208.xo_text.d.ptr = (char16_t *)0x0;
    local_208.xo_text.d.size = 0;
    local_208.xo_value.d.d = (Data *)0x0;
    local_208.xo_value.d.ptr = (char16_t *)0x0;
    local_208.xo_value.d.size = 0;
  }
  else {
    QVar26.m_data = &DAT_0000000c;
    QVar26.m_size = (qsizetype)&local_208;
    QString::fromUtf8(QVar26);
    local_208.xo_text.d.size = (qsizetype)local_208.xo_text.d.ptr;
    pQVar6 = (QArrayData *)CONCAT44(local_208._4_4_,local_208.xo_type);
    local_208.xo_type = tAttribute;
    local_208.xo_text.d.ptr = (char16_t *)local_208.xo_text.d.d;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_208.xo_value.d.d = *(Data **)((long)__buf + 0x78);
    local_208.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x80);
    local_208.xo_value.d.size = *(qsizetype *)((long)__buf + 0x88);
    if (&(local_208.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_208.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_208.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_208.xo_text.d.d = (Data *)pQVar6;
    if (pQVar6 != (QArrayData *)0x0) {
      LOCK();
      (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar6,2,0x10);
      }
    }
  }
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_208);
  QVar27.m_data = (storage_type *)0x9;
  QVar27.m_size = (qsizetype)&local_240;
  QString::fromUtf8(QVar27);
  local_240.xo_text.d.size = (qsizetype)local_240.xo_text.d.ptr;
  pQVar6 = (QArrayData *)CONCAT44(local_240._4_4_,local_240.xo_type);
  local_240.xo_type = tTag;
  local_240.xo_text.d.ptr = (char16_t *)local_240.xo_text.d.d;
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_240.xo_value.d.d = (Data *)0x0;
  local_240.xo_value.d.ptr = (char16_t *)0x0;
  local_240.xo_value.d.size = 0;
  local_240.xo_text.d.d = (Data *)pQVar6;
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_240);
  QVar28.m_data = &DAT_00000008;
  QVar28.m_size = (qsizetype)&local_278;
  QString::fromUtf8(QVar28);
  local_278.xo_text.d.size = (qsizetype)local_278.xo_text.d.ptr;
  pQVar5 = (QArrayData *)CONCAT44(local_278._4_4_,local_278.xo_type);
  local_278.xo_type = tTag;
  local_278.xo_text.d.ptr = (char16_t *)local_278.xo_text.d.d;
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_278.xo_value.d.d = (Data *)0x0;
  local_278.xo_value.d.ptr = (char16_t *)0x0;
  local_278.xo_value.d.size = 0;
  local_278.xo_text.d.d = (Data *)pQVar5;
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_278);
  if (*(long *)((long)__buf + 0xa0) == 0) {
    local_2b0.xo_type = tNothing;
    local_2b0.xo_text.d.d = (Data *)0x0;
    local_2b0.xo_text.d.ptr = (char16_t *)0x0;
    local_2b0.xo_text.d.size = 0;
    local_2b0.xo_value.d.d = (Data *)0x0;
    local_2b0.xo_value.d.ptr = (char16_t *)0x0;
    local_2b0.xo_value.d.size = 0;
  }
  else {
    QVar29.m_data = (storage_type *)0x4;
    QVar29.m_size = (qsizetype)&local_2b0;
    QString::fromUtf8(QVar29);
    local_2b0.xo_text.d.size = (qsizetype)local_2b0.xo_text.d.ptr;
    pQVar4 = (QArrayData *)CONCAT44(local_2b0._4_4_,local_2b0.xo_type);
    local_2b0.xo_type = tAttribute;
    local_2b0.xo_text.d.ptr = (char16_t *)local_2b0.xo_text.d.d;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_2b0.xo_value.d.d = *(Data **)((long)__buf + 0x90);
    local_2b0.xo_value.d.ptr = *(char16_t **)((long)__buf + 0x98);
    local_2b0.xo_value.d.size = *(qsizetype *)((long)__buf + 0xa0);
    if (&(local_2b0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_2b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_2b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + 1;
      UNLOCK();
    }
    local_2b0.xo_text.d.d = (Data *)pQVar4;
    if (pQVar4 != (QArrayData *)0x0) {
      LOCK();
      (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar4,2,0x10);
      }
    }
  }
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_2b0);
  QVar30.m_data = (storage_type *)0x9;
  QVar30.m_size = (qsizetype)&local_2e8;
  QString::fromUtf8(QVar30);
  local_2e8.xo_text.d.size = (qsizetype)local_2e8.xo_text.d.ptr;
  pQVar4 = (QArrayData *)CONCAT44(local_2e8._4_4_,local_2e8.xo_type);
  local_2e8.xo_type = tCloseTag;
  local_2e8.xo_text.d.ptr = (char16_t *)local_2e8.xo_text.d.d;
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_2e8.xo_value.d.d = (Data *)0x0;
  local_2e8.xo_value.d.ptr = (char16_t *)0x0;
  local_2e8.xo_value.d.size = 0;
  local_2e8.xo_text.d.d = (Data *)pQVar4;
  pXVar11 = XmlOutput::operator<<(pXVar11,&local_2e8);
  QVar31.m_data = (storage_type *)0xe;
  QVar31.m_size = (qsizetype)&local_320;
  QString::fromUtf8(QVar31);
  local_320.xo_text.d.size = (qsizetype)local_320.xo_text.d.ptr;
  pQVar3 = (QArrayData *)CONCAT44(local_320._4_4_,local_320.xo_type);
  local_320.xo_type = tTag;
  local_320.xo_text.d.ptr = (char16_t *)local_320.xo_text.d.d;
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_320.xo_value.d.d = (Data *)0x0;
  local_320.xo_value.d.ptr = (char16_t *)0x0;
  local_320.xo_value.d.size = 0;
  local_320.xo_text.d.d = (Data *)pQVar3;
  XmlOutput::operator<<(pXVar11,&local_320);
  if (&(local_320.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_320.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_320.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_320.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_320.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_320.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_320.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_320.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_320.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_320.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (&(local_2e8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2e8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2e8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2e8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2e8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2e8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar4 != (QArrayData *)0x0) {
    LOCK();
    (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar4->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar4->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar4,2,0x10);
    }
  }
  if (&(local_2b0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2b0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_2b0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_2b0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_2b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_2b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_2b0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_2b0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_278.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_278.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_278.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_278.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_278.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_278.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_278.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_278.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_278.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_278.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar5 != (QArrayData *)0x0) {
    LOCK();
    (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar5,2,0x10);
    }
  }
  if (&(local_240.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_240.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_240.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_240.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_240.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_240.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_240.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_240.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_240.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_240.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar6 != (QArrayData *)0x0) {
    LOCK();
    (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar6,2,0x10);
    }
  }
  if (&(local_208.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_208.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_208.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_208.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_208.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_208.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_208.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_208.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_208.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_208.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1d0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1d0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_1d0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_1d0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_1d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_1d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_1d0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_1d0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_198.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_198.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_198.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_198.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_198.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_198.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_198.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_198.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_198.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_198.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_160.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_160.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_160.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_160.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_160.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_160.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_160.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_160.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_160.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_160.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_128.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_128.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_128.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_128.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_128.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
    }
  }
  if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar7 != (QArrayData *)0x0) {
    LOCK();
    (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar7->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar7->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar7,2,0x10);
    }
  }
  if ((QArrayData *)local_440.Version.d.ptr != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_440.Version.d.ptr)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_440.Version.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_440.Version.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_440.Version.d.ptr,2,0x10);
    }
  }
  if ((QArrayData *)local_440.Name.d.ptr != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_440.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_440.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_440.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_440.Name.d.ptr,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  (*this->_vptr_VCProjectWriter[0xe])(this,pXVar13,(long)__buf + 0xc0);
  QVar32.m_data = (storage_type *)0xe;
  QVar32.m_size = (qsizetype)&local_440;
  QString::fromUtf8(QVar32);
  local_440.Version.d.d = (Data *)local_440.Name.d.size;
  pQVar1 = (QArrayData *)CONCAT44(local_440.Name.d.d._4_4_,local_440.Name.d.d._0_4_);
  local_440.Name.d.d._0_4_ = 6;
  local_440.Name.d.size = (qsizetype)local_440.Name.d.ptr;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_440.Version.d.ptr = (char16_t *)0x0;
  local_440.Version.d.size = 0;
  local_440.ProjectGUID.d.d = (Data *)0x0;
  local_440.Name.d.ptr = (char16_t *)pQVar1;
  pXVar11 = XmlOutput::operator<<(pXVar13,(xml_output *)&local_440);
  QVar33.m_data = (storage_type *)0x5;
  QVar33.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar33);
  local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
  pQVar2 = (QArrayData *)CONCAT44(local_78._4_4_,local_78.xo_type);
  local_78.xo_type = tTag;
  local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78.xo_value.d.d = (Data *)0x0;
  local_78.xo_value.d.ptr = (char16_t *)0x0;
  local_78.xo_value.d.size = 0;
  local_78.xo_text.d.d = (Data *)pQVar2;
  XmlOutput::operator<<(pXVar11,&local_78);
  if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,2,0x10);
    }
  }
  if ((QArrayData *)local_440.Version.d.ptr != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_440.Version.d.ptr)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_440.Version.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_440.Version.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate((QArrayData *)local_440.Version.d.ptr,2,0x10);
    }
  }
  if ((QArrayData *)local_440.Name.d.ptr != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_440.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_440.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_440.Name.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_440.Name.d.ptr,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  memset(&local_440,0,0x120);
  QtPrivate::QMovableArrayOps<VCProjectSingleConfig>::emplace<VCProjectSingleConfig_const&>
            ((QMovableArrayOps<VCProjectSingleConfig> *)&local_440.SingleProjects,0,
             (VCProjectSingleConfig *)__buf);
  QList<VCProjectSingleConfig>::end(&local_440.SingleProjects);
  QVar34.m_data = &DAT_0000000c;
  QVar34.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar34);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QVar35.m_data = &DAT_0000000c;
  QVar35.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar35);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QVar36.m_data = (storage_type *)0xf;
  QVar36.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar36);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QVar37.m_data = (storage_type *)0xd;
  QVar37.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar37);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QVar38.m_data = (storage_type *)0x11;
  QVar38.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar38);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QVar39.m_data = (storage_type *)0xa;
  QVar39.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar39);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QVar40.m_data = (storage_type *)0xe;
  QVar40.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar40);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QVar41.m_data = (storage_type *)0x10;
  QVar41.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar41);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QVar42.m_data = (storage_type *)0x12;
  QVar42.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar42);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  local_128._0_8_ = (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0;
  if (*(long *)((long)__buf + 0x3a00) != 0) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      key = (QString *)(*(long *)((long)__buf + 0x39f8) + lVar14);
      if ((Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)local_128._0_8_ ==
          (Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)0x0) {
LAB_00224086:
        QHash<QString,QHashDummyValue>::emplace<QHashDummyValue_const&>
                  ((QHash<QString,QHashDummyValue> *)&local_128,key,(QHashDummyValue *)&local_78);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)&local_440.ExtraCompilers,
                   local_440.ExtraCompilers.d.size,key);
        QList<QString>::end(&local_440.ExtraCompilers);
      }
      else {
        pNVar12 = QHashPrivate::Data<QHashPrivate::Node<QString,_QHashDummyValue>_>::
                  findNode<QString>((Data<QHashPrivate::Node<QString,_QHashDummyValue>_> *)
                                    local_128._0_8_,key);
        if (pNVar12 == (Node<QString,_QHashDummyValue> *)0x0) goto LAB_00224086;
      }
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x448;
    } while (uVar15 < *(ulong *)((long)__buf + 0x3a00));
  }
  if (local_440.ExtraCompilers.d.size != 0) {
    lVar14 = 0;
    uVar15 = 0;
    do {
      outputFilter(&local_440,pXVar13,
                   (QString *)((long)&((local_440.ExtraCompilers.d.ptr)->d).d + lVar14));
      uVar15 = uVar15 + 1;
      lVar14 = lVar14 + 0x18;
    } while (uVar15 < (ulong)local_440.ExtraCompilers.d.size);
  }
  QVar43.m_data = (storage_type *)0xa;
  QVar43.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar43);
  local_b8._0_8_ = CONCAT44(local_78._4_4_,local_78.xo_type);
  local_b8.xo_text.d.d = local_78.xo_text.d.d;
  local_b8.xo_text.d.ptr = local_78.xo_text.d.ptr;
  outputFilter(&local_440,pXVar13,(QString *)&local_b8);
  if ((QArrayData *)local_b8._0_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_b8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_b8._0_8_,2,0x10);
    }
  }
  QVar44.m_data = (storage_type *)0x5;
  QVar44.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar44);
  local_78.xo_text.d.size = (qsizetype)local_78.xo_text.d.ptr;
  pQVar1 = (QArrayData *)CONCAT44(local_78._4_4_,local_78.xo_type);
  local_78.xo_type = tCloseTag;
  local_78.xo_text.d.ptr = (char16_t *)local_78.xo_text.d.d;
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_78.xo_value.d.d = (Data *)0x0;
  local_78.xo_value.d.ptr = (char16_t *)0x0;
  local_78.xo_value.d.size = 0;
  local_78.xo_text.d.d = (Data *)pQVar1;
  pXVar13 = XmlOutput::operator<<(pXVar13,&local_78);
  QVar45.m_data = (storage_type *)0x7;
  QVar45.m_size = (qsizetype)&local_b8;
  QString::fromUtf8(QVar45);
  local_b8.xo_text.d.size = (qsizetype)local_b8.xo_text.d.ptr;
  local_b8.xo_text.d.ptr = (char16_t *)local_b8.xo_text.d.d;
  uVar10 = local_b8._0_8_;
  local_b8.xo_type = tTag;
  local_b8.xo_text.d.d = (Data *)uVar10;
  if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_b8.xo_value.d.d = (Data *)0x0;
  local_b8.xo_value.d.ptr = (char16_t *)0x0;
  local_b8.xo_value.d.size = 0;
  pXVar13 = XmlOutput::operator<<(pXVar13,&local_b8);
  local_f0.xo_type = tData;
  local_f0.xo_text.d.d = (Data *)0x0;
  local_f0.xo_text.d.ptr = (char16_t *)0x0;
  local_f0.xo_text.d.size = 0;
  local_f0.xo_value.d.d = (Data *)0x0;
  local_f0.xo_value.d.ptr = (char16_t *)0x0;
  local_f0.xo_value.d.size = 0;
  XmlOutput::operator<<(pXVar13,&local_f0);
  if (&(local_f0.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_f0.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_f0.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f0.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_f0.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_f0.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_b8.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_b8.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_b8.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_b8.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_b8.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((QArrayData *)uVar10 != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)uVar10)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)uVar10,2,0x10);
    }
  }
  if (&(local_78.xo_value.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_78.xo_value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_78.xo_value.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_78.xo_text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
    ;
    UNLOCK();
    if (((local_78.xo_text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
    {
      QArrayData::deallocate(&(local_78.xo_text.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pQVar1 != (QArrayData *)0x0) {
    LOCK();
    (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar1,2,0x10);
    }
  }
  QHash<QString,_QHashDummyValue>::~QHash((QHash<QString,_QHashDummyValue> *)&local_128);
  VCProject::~VCProject(&local_440);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::write(XmlOutput &xml, VCProjectSingleConfig &tool)
{
    xml << decl("1.0", "Windows-1252")
        << tag(_VisualStudioProject)
        << attrS(_ProjectType, "Visual C++")
        << attrS(_Version, tool.Version)
        << attrS(_Name, tool.Name)
        << attrS(_ProjectGUID, tool.ProjectGUID)
        << attrS(_Keyword, tool.Keyword)
        << attrS(_SccProjectName, tool.SccProjectName)
        << attrS(_SccLocalPath, tool.SccLocalPath)
        << tag(_Platforms)
        << tag(_Platform)
        << attrS(_Name, tool.PlatformName)
        << closetag(_Platforms)
        << tag(_Configurations);
    write(xml, tool.Configuration);
    xml << closetag(_Configurations)
        << tag(q_Files);
    // Add this configuration into a multi-config project, since that's where we have the flat/tree
    // XML output functionality
    VCProject tempProj;
    tempProj.SingleProjects += tool;
    outputFilter(tempProj, xml, "Source Files");
    outputFilter(tempProj, xml, "Header Files");
    outputFilter(tempProj, xml, "Generated Files");
    outputFilter(tempProj, xml, "LexYacc Files");
    outputFilter(tempProj, xml, "Translation Files");
    outputFilter(tempProj, xml, "Form Files");
    outputFilter(tempProj, xml, "Resource Files");
    outputFilter(tempProj, xml, "Deployment Files");
    outputFilter(tempProj, xml, "Distribution Files");

    QSet<QString> extraCompilersInProject;
    for (int i = 0; i < tool.ExtraCompilersFiles.size(); ++i) {
        const QString &compilerName = tool.ExtraCompilersFiles.at(i).Name;
        if (!extraCompilersInProject.contains(compilerName)) {
            extraCompilersInProject += compilerName;
            tempProj.ExtraCompilers += compilerName;
        }
    }

    for (int x = 0; x < tempProj.ExtraCompilers.size(); ++x) {
        outputFilter(tempProj, xml, tempProj.ExtraCompilers.at(x));
    }
    outputFilter(tempProj, xml, "Root Files");
    xml     << closetag(q_Files)
            << tag(_Globals)
                << data(); // No "/>" end tag
}